

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v6::internal::
    parse_nonnegative_int<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>&>
              (wchar_t **begin,wchar_t *end,
              id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
              *eh)

{
  wchar_t *pwVar1;
  uint uVar2;
  wchar_t *pwVar3;
  
  uVar2 = 0;
  pwVar1 = *begin;
  do {
    pwVar3 = pwVar1 + 1;
    if (0xccccccc < uVar2) {
      *begin = pwVar1;
      goto LAB_001839ef;
    }
    uVar2 = (*pwVar1 + uVar2 * 10) - 0x30;
  } while ((pwVar3 != end) && (pwVar1 = pwVar3, (uint)(*pwVar3 + L'\xffffffd0') < 10));
  *begin = pwVar3;
  if (-1 < (int)uVar2) {
    return uVar2;
  }
LAB_001839ef:
  error_handler::on_error((error_handler *)begin,"number is too big");
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}